

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::mouseReleaseEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  QStyle *pQVar10;
  int iVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar13 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar14 [16];
  QPersistentModelIndex index;
  QPoint pos;
  QStyleOptionViewItem option;
  QPersistentModelIndex local_158;
  undefined1 *local_150;
  undefined1 local_148 [88];
  QFont local_f0 [24];
  QLocale local_d8 [6];
  QIcon local_a8;
  QArrayData *local_a0;
  QBrush local_80 [8];
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar3 = this_00->releaseFromDoubleClick;
  this_00->releaseFromDoubleClick = false;
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  uVar6 = QEventPoint::position();
  auVar14._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar14._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar14 = minpd(_DAT_0066f5d0,auVar14);
  auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar14._8_8_);
  auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar14._0_8_);
  uVar7 = movmskpd(uVar6,auVar13);
  uVar9 = 0x8000000000000000;
  if ((uVar7 & 1) != 0) {
    uVar9 = (ulong)(uint)(int)auVar14._0_8_ << 0x20;
  }
  uVar8 = 0x80000000;
  if ((uVar7 & 2) != 0) {
    uVar8 = (ulong)(uint)(int)auVar14._8_8_;
  }
  local_150 = (undefined1 *)(uVar8 | uVar9);
  local_158.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))((QModelIndex *)local_148,this,&local_150);
  QPersistentModelIndex::QPersistentModelIndex(&local_158,(QModelIndex *)local_148);
  if (*(int *)(*(long *)(this + 8) + 0x3a8) == 3) {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
    if (((-1 < (int)local_148._0_4_) && (-1 < (int)local_148._4_4_)) &&
       ((QAbstractItemModel *)local_148._16_8_ == this_00->model)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
      uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58);
      if ((uVar9 & 0x20) != 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_158);
        bVar3 = QAbstractItemViewPrivate::sendDelegateEvent(this_00,&local_78,(QEvent *)event);
        if (bVar3) {
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
          update(this,(QModelIndex *)local_148);
        }
      }
    }
  }
  else {
    cVar4 = comparesEqual(&local_158,&this_00->pressedIndex);
    bVar5 = 0;
    if (cVar4 != '\0') {
      bVar5 = QPersistentModelIndex::isValid();
      bVar5 = (bVar3 ^ 1U) & bVar5;
    }
    iVar11 = 0;
    if (((bVar5 != 0) && (iVar11 = 0, this_00->pressedAlreadySelected == true)) &&
       (*(int *)(event + 0x40) == 1)) {
      iVar11 = (uint)(*(int *)(event + 0x20) == 0) << 2;
    }
    if ((bVar5 == 0) || (this_00->pressClosedEditor != false)) {
      cVar4 = '\0';
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
      cVar4 = (**(code **)(*(long *)this + 0x2e0))(this,(QModelIndex *)local_148,iVar11,event);
    }
    this_00->ctrlDragSelectionFlag = NoUpdate;
    pDVar1 = (this_00->selectionModel).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       (((this_00->selectionModel).wp.value != (QObject *)0x0 &&
        ((this_00->noSelectionOnMousePress == true &&
         (this_00->noSelectionOnMousePress = false, this_00->pressClosedEditor == false)))))) {
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar12 = (QObject *)0x0;
      }
      else {
        pQVar12 = (this_00->selectionModel).wp.value;
      }
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
      uVar6 = (**(code **)(*(long *)this + 0x2e8))(this,&local_58,event);
      (**(code **)(*(long *)pQVar12 + 0x68))(pQVar12,local_148,uVar6);
    }
    this_00->pressClosedEditor = false;
    *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
    if (bVar5 != 0) {
      if (*(int *)(event + 0x40) == 1) {
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_148,&local_158);
        local_58.r = 0;
        local_58.c = 0;
        local_58.i = (quintptr)local_148;
        QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
      }
      if (cVar4 == '\0') {
        memset((QStyleOptionViewItem *)local_148,0xaa,0xd0);
        QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_148);
        (**(code **)(*(long *)this + 0x2f8))(this,(QStyleOptionViewItem *)local_148);
        if (this_00->pressedAlreadySelected == true) {
          local_148[9] = local_148[9] | 0x80;
        }
        pQVar2 = this_00->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
        uVar9 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,&local_58);
        if ((uVar9 & 0x20) != 0) {
          pQVar10 = QWidget::style((QWidget *)this);
          iVar11 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x3d,local_148,this,0);
          if (iVar11 != 0) {
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&local_158);
            local_78.r = 0;
            local_78.c = 0;
            local_78.i = (quintptr)&local_58;
            QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_78);
          }
        }
        QBrush::~QBrush(local_80);
        if (local_a0 != (QArrayData *)0x0) {
          LOCK();
          (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0,2,0x10);
          }
        }
        QIcon::~QIcon(&local_a8);
        QLocale::~QLocale(local_d8);
        QFont::~QFont(local_f0);
        QStyleOption::~QStyleOption((QStyleOption *)local_148);
      }
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    const bool releaseFromDoubleClick = d->releaseFromDoubleClick;
    d->releaseFromDoubleClick = false;

    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    if (state() == EditingState) {
        if (d->isIndexValid(index)
            && d->isIndexEnabled(index)
            && d->sendDelegateEvent(index, event))
            update(index);
        return;
    }

    bool click = (index == d->pressedIndex && index.isValid() && !releaseFromDoubleClick);
    bool selectedClicked = click && d->pressedAlreadySelected
                        && (event->button() == Qt::LeftButton)
                        && (event->modifiers() == Qt::NoModifier);
    EditTrigger trigger = (selectedClicked ? SelectedClicked : NoEditTriggers);
    const bool edited = click && !d->pressClosedEditor ? edit(index, trigger, event) : false;

    d->ctrlDragSelectionFlag = QItemSelectionModel::NoUpdate;

    if (d->selectionModel && d->noSelectionOnMousePress) {
        d->noSelectionOnMousePress = false;
        if (!d->pressClosedEditor)
            d->selectionModel->select(index, selectionCommand(index, event));
    }

    d->pressClosedEditor = false;
    setState(NoState);

    if (click) {
        if (event->button() == Qt::LeftButton)
            emit clicked(index);
        if (edited)
            return;
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        if (d->pressedAlreadySelected)
            option.state |= QStyle::State_Selected;
        if ((d->model->flags(index) & Qt::ItemIsEnabled)
            && style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, &option, this))
            emit activated(index);
    }
}